

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::GroupSegPlanesSimple(FNodeBuilder *this)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FPrivVert *pFVar6;
  fixed_t *pfVar7;
  FPrivSeg **ppFVar8;
  long lVar9;
  uint uVar10;
  
  TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Resize
            (&this->Planes,(this->Segs).Count);
  uVar10 = (this->Segs).Count;
  if (0 < (long)(int)uVar10) {
    pFVar6 = (this->Vertices).Array;
    ppFVar8 = &((this->Segs).Array)->hashnext;
    pfVar7 = &((this->Planes).Array)->dy;
    lVar9 = 0;
    do {
      lVar1 = lVar9 + 1;
      *(DWORD *)(ppFVar8 + -4) = (DWORD)lVar1;
      *ppFVar8 = (FPrivSeg *)0x0;
      *(int *)(ppFVar8 + -1) = (int)lVar9;
      *(bool *)((long)ppFVar8 + -4) = true;
      iVar3 = ((FPrivSeg *)(ppFVar8 + -8))->v1;
      iVar4 = pFVar6[iVar3].super_FSimpleVert.x;
      ((FSimpleLine *)(pfVar7 + -3))->x = iVar4;
      iVar3 = pFVar6[iVar3].super_FSimpleVert.y;
      pfVar7[-2] = iVar3;
      iVar5 = *(int *)((long)ppFVar8 + -0x3c);
      pfVar7[-1] = pFVar6[iVar5].super_FSimpleVert.x - iVar4;
      *pfVar7 = pFVar6[iVar5].super_FSimpleVert.y - iVar3;
      ppFVar8 = ppFVar8 + 9;
      pfVar7 = pfVar7 + 4;
      lVar9 = lVar1;
    } while ((int)uVar10 != lVar1);
  }
  (this->Segs).Array[uVar10 - 1].next = 0xffffffff;
  uVar10 = uVar10 + 7 >> 3;
  TArray<unsigned_char,_unsigned_char>::Grow(&this->PlaneChecked,uVar10);
  puVar2 = &(this->PlaneChecked).Count;
  *puVar2 = *puVar2 + uVar10;
  return;
}

Assistant:

void FNodeBuilder::GroupSegPlanesSimple()
{
	Planes.Resize(Segs.Size());
	for (int i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		FSimpleLine *pline = &Planes[i];
		seg->next = i+1;
		seg->hashnext = NULL;
		seg->planenum = i;
		seg->planefront = true;
		pline->x = Vertices[seg->v1].x;
		pline->y = Vertices[seg->v1].y;
		pline->dx = Vertices[seg->v2].x - Vertices[seg->v1].x;
		pline->dy = Vertices[seg->v2].y - Vertices[seg->v1].y;
	}
	Segs.Last().next = DWORD_MAX;
	PlaneChecked.Reserve((Segs.Size() + 7) / 8);
}